

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metablock.c
# Opt level: O0

void BrotliOptimizeHistograms
               (size_t num_direct_distance_codes,size_t distance_postfix_bits,MetaBlockSplit *mb)

{
  ulong local_2f8;
  size_t i;
  size_t num_distance_codes;
  uint8_t good_for_rle [704];
  MetaBlockSplit *mb_local;
  size_t distance_postfix_bits_local;
  size_t num_direct_distance_codes_local;
  
  for (local_2f8 = 0; local_2f8 < mb->literal_histograms_size; local_2f8 = local_2f8 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              (0x100,mb->literal_histograms[local_2f8].data_,(uint8_t *)&num_distance_codes);
  }
  for (local_2f8 = 0; local_2f8 < mb->command_histograms_size; local_2f8 = local_2f8 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              (0x2c0,mb->command_histograms[local_2f8].data_,(uint8_t *)&num_distance_codes);
  }
  for (local_2f8 = 0; local_2f8 < mb->distance_histograms_size; local_2f8 = local_2f8 + 1) {
    BrotliOptimizeHuffmanCountsForRle
              (num_direct_distance_codes + 0x10 +
               (ulong)(uint)(0x30 << ((byte)distance_postfix_bits & 0x1f)),
               mb->distance_histograms[local_2f8].data_,(uint8_t *)&num_distance_codes);
  }
  return;
}

Assistant:

void BrotliOptimizeHistograms(size_t num_direct_distance_codes,
                              size_t distance_postfix_bits,
                              MetaBlockSplit* mb) {
  uint8_t good_for_rle[BROTLI_NUM_COMMAND_SYMBOLS];
  size_t num_distance_codes;
  size_t i;
  for (i = 0; i < mb->literal_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(256, mb->literal_histograms[i].data_,
                                      good_for_rle);
  }
  for (i = 0; i < mb->command_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(BROTLI_NUM_COMMAND_SYMBOLS,
                                      mb->command_histograms[i].data_,
                                      good_for_rle);
  }
  num_distance_codes = BROTLI_NUM_DISTANCE_SHORT_CODES +
      num_direct_distance_codes +
      ((2 * BROTLI_MAX_DISTANCE_BITS) << distance_postfix_bits);
  for (i = 0; i < mb->distance_histograms_size; ++i) {
    BrotliOptimizeHuffmanCountsForRle(num_distance_codes,
                                      mb->distance_histograms[i].data_,
                                      good_for_rle);
  }
}